

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O1

dynamic_string * __thiscall
crnlib::dynamic_string::set_from_raw_buf_and_assume_ownership
          (dynamic_string *this,char *pBuf,uint buf_size_in_chars,uint len_in_chars)

{
  clear(this);
  this->m_pStr = pBuf;
  this->m_buf_size = (uint16)buf_size_in_chars;
  this->m_len = (uint16)len_in_chars;
  return this;
}

Assistant:

dynamic_string& dynamic_string::set_from_raw_buf_and_assume_ownership(char* pBuf, uint buf_size_in_chars, uint len_in_chars)
    {
        CRNLIB_ASSERT(buf_size_in_chars <= cUINT16_MAX);
        CRNLIB_ASSERT(math::is_power_of_2(buf_size_in_chars) || (buf_size_in_chars == cUINT16_MAX));
        CRNLIB_ASSERT((len_in_chars + 1) <= buf_size_in_chars);

        clear();

        m_pStr = pBuf;
        m_buf_size = static_cast<uint16>(buf_size_in_chars);
        m_len = static_cast<uint16>(len_in_chars);

        check();

        return *this;
    }